

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

ClientRequest * __thiscall
cmFileAPI::BuildClientRequest(ClientRequest *__return_storage_ptr__,cmFileAPI *this,Value *request)

{
  string *error;
  bool bVar1;
  Value *this_00;
  cmFileAPI *this_01;
  ObjectKind OVar2;
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> versions;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->super_Object).Version = 0;
  error = &__return_storage_ptr__->Error;
  (__return_storage_ptr__->Error)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Error).field_2;
  (__return_storage_ptr__->Error)._M_string_length = 0;
  (__return_storage_ptr__->Error).field_2._M_local_buf[0] = '\0';
  bVar1 = Json::Value::isObject(request);
  if (!bVar1) {
    std::__cxx11::string::assign((char *)error);
    return __return_storage_ptr__;
  }
  this_00 = Json::Value::operator[](request,"kind");
  bVar1 = Json::Value::isNull(this_00);
  if ((bVar1) || (bVar1 = Json::Value::isString(this_00), !bVar1)) {
    std::__cxx11::string::assign((char *)error);
    return __return_storage_ptr__;
  }
  Json::Value::asString_abi_cxx11_(&local_60,this_00);
  bVar1 = std::operator==(&local_60,"codemodel");
  OVar2 = CodeModel;
  if (!bVar1) {
    bVar1 = std::operator==(&local_60,"cache");
    if (bVar1) {
      OVar2 = Cache;
    }
    else {
      bVar1 = std::operator==(&local_60,"cmakeFiles");
      if (bVar1) {
        OVar2 = CMakeFiles;
      }
      else {
        bVar1 = std::operator==(&local_60,"__test");
        if (!bVar1) {
          std::operator+(&local_40,"unknown request kind \'",&local_60);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &versions,&local_40,"\'");
          std::__cxx11::string::operator=((string *)error,(string *)&versions);
          std::__cxx11::string::~string((string *)&versions);
          std::__cxx11::string::~string((string *)&local_40);
          goto LAB_0025c427;
        }
        OVar2 = InternalTest;
      }
    }
  }
  (__return_storage_ptr__->super_Object).Kind = OVar2;
  this_01 = (cmFileAPI *)Json::Value::operator[](request,"version");
  bVar1 = Json::Value::isNull((Value *)this_01);
  if (bVar1) {
    std::__cxx11::string::assign((char *)error);
  }
  else {
    versions.
    super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    versions.
    super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    versions.
    super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = ReadRequestVersions((Value *)this_01,&versions,error);
    if (bVar1) {
      switch((__return_storage_ptr__->super_Object).Kind) {
      case CodeModel:
        BuildClientRequestCodeModel(this_01,__return_storage_ptr__,&versions);
        break;
      case Cache:
        BuildClientRequestCache(this_01,__return_storage_ptr__,&versions);
        break;
      case CMakeFiles:
        BuildClientRequestCMakeFiles(this_01,__return_storage_ptr__,&versions);
        break;
      case InternalTest:
        BuildClientRequestInternalTest(this_01,__return_storage_ptr__,&versions);
      }
    }
    std::_Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>::
    ~_Vector_base(&versions.
                   super__Vector_base<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>
                 );
  }
LAB_0025c427:
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

cmFileAPI::ClientRequest cmFileAPI::BuildClientRequest(
  Json::Value const& request)
{
  ClientRequest r;

  if (!request.isObject()) {
    r.Error = "request is not an object";
    return r;
  }

  Json::Value const& kind = request["kind"];
  if (kind.isNull()) {
    r.Error = "'kind' member missing";
    return r;
  }
  if (!kind.isString()) {
    r.Error = "'kind' member is not a string";
    return r;
  }
  std::string const& kindName = kind.asString();

  if (kindName == this->ObjectKindName(ObjectKind::CodeModel)) {
    r.Kind = ObjectKind::CodeModel;
  } else if (kindName == this->ObjectKindName(ObjectKind::Cache)) {
    r.Kind = ObjectKind::Cache;
  } else if (kindName == this->ObjectKindName(ObjectKind::CMakeFiles)) {
    r.Kind = ObjectKind::CMakeFiles;
  } else if (kindName == this->ObjectKindName(ObjectKind::InternalTest)) {
    r.Kind = ObjectKind::InternalTest;
  } else {
    r.Error = "unknown request kind '" + kindName + "'";
    return r;
  }

  Json::Value const& version = request["version"];
  if (version.isNull()) {
    r.Error = "'version' member missing";
    return r;
  }
  std::vector<RequestVersion> versions;
  if (!cmFileAPI::ReadRequestVersions(version, versions, r.Error)) {
    return r;
  }

  switch (r.Kind) {
    case ObjectKind::CodeModel:
      this->BuildClientRequestCodeModel(r, versions);
      break;
    case ObjectKind::Cache:
      this->BuildClientRequestCache(r, versions);
      break;
    case ObjectKind::CMakeFiles:
      this->BuildClientRequestCMakeFiles(r, versions);
      break;
    case ObjectKind::InternalTest:
      this->BuildClientRequestInternalTest(r, versions);
      break;
  }

  return r;
}